

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::SharedDepthStencilTest::render
          (SharedDepthStencilTest *this,Context *context,Surface *dst)

{
  GLenum GVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  deUint32 program;
  uint uVar6;
  uint uVar7;
  deUint32 dVar8;
  DataTypes *samplerTypes;
  TestError *this_00;
  uint uVar9;
  Vector<float,_4> local_4cc;
  Vector<float,_4> local_4bc;
  TextureFormat local_4ac;
  Vector<float,_3> local_4a4;
  Vector<float,_3> local_498;
  Vector<float,_3> local_48c;
  Vector<float,_3> local_480;
  Vector<float,_3> local_474;
  Vector<float,_3> local_468;
  Vector<float,_4> local_45c;
  Vector<float,_3> local_44c;
  Vector<float,_3> local_440;
  Vector<float,_3> local_434;
  Vector<float,_3> local_428;
  uint local_41c;
  uint local_418;
  deUint32 point;
  deUint32 bit;
  int ndx;
  Framebuffer fboB;
  FboConfig cfg;
  Framebuffer fboA;
  deUint32 quadsTex;
  deUint32 metaballsTex;
  bool stencil;
  int height;
  int width;
  deUint32 flatShaderID;
  deUint32 texShaderID;
  FlatColorShader flatShader;
  Vector<float,_4> local_1f4;
  DataTypes local_1d8;
  undefined1 local_1b8 [8];
  Texture2DShader texShader;
  Surface *dst_local;
  Context *context_local;
  SharedDepthStencilTest *this_local;
  
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texShader._400_8_ = dst;
  FboTestUtil::DataTypes::DataTypes(&local_1d8);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_1d8,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector(&local_1f4,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&flatShader.super_ShaderProgram.field_0x154,0.0)
  ;
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_1b8,samplerTypes,TYPE_FLOAT_VEC4,&local_1f4,
             (Vec4 *)&flatShader.super_ShaderProgram.field_0x154);
  FboTestUtil::DataTypes::~DataTypes(&local_1d8);
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)&flatShaderID,TYPE_FLOAT_VEC4);
  program = (*context->_vptr_Context[0x75])(context,local_1b8);
  uVar6 = (*context->_vptr_Context[0x75])(context,&flatShaderID);
  uVar7 = (this->super_FboRenderCase).m_config.buffers >> 10;
  createMetaballsTex2D(context,5,0x1907,0x1401,0x40,0x40);
  createQuadsTex2D(context,6,0x1907,0x1401,0x40,0x40);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)&cfg.height,context,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,
             0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)&cfg.height);
  uVar2._0_4_ = (this->super_FboRenderCase).m_config.buffers;
  uVar2._4_4_ = (this->super_FboRenderCase).m_config.colorType;
  uVar3._0_4_ = (this->super_FboRenderCase).m_config.colorFormat;
  uVar3._4_4_ = (this->super_FboRenderCase).m_config.depthStencilType;
  uVar4._0_4_ = (this->super_FboRenderCase).m_config.depthStencilFormat;
  uVar4._4_4_ = (this->super_FboRenderCase).m_config.width;
  cfg.depthStencilFormat = (this->super_FboRenderCase).m_config.height;
  cfg.width = (this->super_FboRenderCase).m_config.samples;
  fboB._48_8_ = uVar2 & 0xfffffffffffffaff;
  cfg._0_8_ = uVar3 & 0xffffffff;
  cfg._8_8_ = uVar4 & 0xffffffff00000000;
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)&bit,context,(FboConfig *)&fboB.m_depthStencilBuffer,0x80,0x80,0,0,0);
  dVar8 = Functional::Framebuffer::getFramebuffer((Framebuffer *)&bit);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar8);
  point = 0;
  do {
    if (1 < (int)point) {
      FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_1b8,context,program);
      (*context->_vptr_Context[0x2a])(0x3f800000,0);
      (*context->_vptr_Context[0x2c])(context,1);
      (*context->_vptr_Context[0x2d])(context,0x4500);
      (*context->_vptr_Context[0x33])(context,0xb71);
      dVar8 = Functional::Framebuffer::getFramebuffer((Framebuffer *)&cfg.height);
      (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar8);
      (*context->_vptr_Context[6])(context,0xde1,6);
      tcu::Vector<float,_3>::Vector(&local_428,-1.0,-1.0,0.0);
      tcu::Vector<float,_3>::Vector(&local_434,1.0,1.0,0.0);
      sglr::drawQuad(context,program,&local_428,&local_434);
      if ((uVar7 & 1) != 0) {
        (*context->_vptr_Context[0x33])(context,0xc11);
        (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
        (*context->_vptr_Context[0x2c])(context,0);
        (*context->_vptr_Context[0x2d])(context,0x400);
        (*context->_vptr_Context[0x34])(context,0xc11);
      }
      dVar8 = Functional::Framebuffer::getFramebuffer((Framebuffer *)&bit);
      (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar8);
      (*context->_vptr_Context[6])(context,0xde1,5);
      tcu::Vector<float,_3>::Vector(&local_440,-1.0,-1.0,-1.0);
      tcu::Vector<float,_3>::Vector(&local_44c,1.0,1.0,1.0);
      sglr::drawQuad(context,program,&local_440,&local_44c);
      (*context->_vptr_Context[0x34])(context,0xb71);
      if ((uVar7 & 1) != 0) {
        (*context->_vptr_Context[0x33])(context,0xb90);
        (*context->_vptr_Context[0x35])(context,0x202,0,0xff);
        (*context->_vptr_Context[0x76])(context,(ulong)uVar6);
        tcu::Vector<float,_4>::Vector(&local_45c,0.0,1.0,0.0,1.0);
        FboTestUtil::FlatColorShader::setColor
                  ((FlatColorShader *)&flatShaderID,context,uVar6,&local_45c);
        tcu::Vector<float,_3>::Vector(&local_468,-1.0,-1.0,0.0);
        tcu::Vector<float,_3>::Vector(&local_474,1.0,1.0,0.0);
        sglr::drawQuad(context,uVar6,&local_468,&local_474);
        (*context->_vptr_Context[0x34])(context,0xb90);
      }
      uVar5 = texShader._400_8_;
      if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
        (*context->_vptr_Context[9])(context,0x8d40,0);
        uVar6 = (*context->_vptr_Context[2])();
        uVar7 = (*context->_vptr_Context[3])();
        (*context->_vptr_Context[5])(context,0,0,(ulong)uVar6,(ulong)uVar7);
        dVar8 = Functional::Framebuffer::getColorBuffer((Framebuffer *)&cfg.height);
        (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar8);
        tcu::Vector<float,_3>::Vector(&local_480,-1.0,-1.0,0.0);
        tcu::Vector<float,_3>::Vector(&local_48c,0.0,1.0,0.0);
        sglr::drawQuad(context,program,&local_480,&local_48c);
        dVar8 = Functional::Framebuffer::getColorBuffer((Framebuffer *)&bit);
        (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar8);
        tcu::Vector<float,_3>::Vector(&local_498,0.0,-1.0,0.0);
        tcu::Vector<float,_3>::Vector(&local_4a4,1.0,1.0,0.0);
        sglr::drawQuad(context,program,&local_498,&local_4a4);
        uVar5 = texShader._400_8_;
        uVar6 = (*context->_vptr_Context[2])();
        uVar7 = (*context->_vptr_Context[3])();
        (*context->_vptr_Context[0x80])(context,uVar5,0,0,(ulong)uVar6,(ulong)uVar7);
      }
      else {
        local_4ac = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
        tcu::Vector<float,_4>::Vector(&local_4bc,1.0);
        tcu::Vector<float,_4>::Vector(&local_4cc,0.0);
        FboTestUtil::readPixels
                  (context,(Surface *)uVar5,0,0,0x80,0x80,&local_4ac,&local_4bc,&local_4cc);
      }
      Functional::Framebuffer::~Framebuffer((Framebuffer *)&bit);
      Functional::Framebuffer::~Framebuffer((Framebuffer *)&cfg.height);
      FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&flatShaderID);
      FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_1b8);
      return;
    }
    local_418 = 0x100;
    if (point != 0) {
      local_418 = 0x400;
    }
    uVar9 = 0x8d00;
    if (point != 0) {
      uVar9 = 0x8d20;
    }
    local_41c = uVar9;
    if (((this->super_FboRenderCase).m_config.buffers & local_418) != 0) {
      GVar1 = (this->super_FboRenderCase).m_config.depthStencilType;
      if (GVar1 == 0xde1) {
        dVar8 = Functional::Framebuffer::getDepthStencilBuffer((Framebuffer *)&cfg.height);
        (*context->_vptr_Context[0x1e])(context,0x8d40,(ulong)uVar9,0xde1,(ulong)dVar8,0);
      }
      else {
        if (GVar1 != 0x8d41) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Not implemented",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                     ,0x386);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar8 = Functional::Framebuffer::getDepthStencilBuffer((Framebuffer *)&cfg.height);
        (*context->_vptr_Context[0x20])(context,0x8d40,(ulong)uVar9,0x8d41,(ulong)dVar8);
      }
    }
    point = point + 1;
  } while( true );
}

Assistant:

void SharedDepthStencilTest::render (sglr::Context& context, Surface& dst)
{
	Texture2DShader	texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
	FlatColorShader	flatShader		(glu::TYPE_FLOAT_VEC4);
	deUint32		texShaderID		= context.createProgram(&texShader);
	deUint32		flatShaderID	= context.createProgram(&flatShader);
	int				width			= 128;
	int				height			= 128;
//	bool			depth			= (m_config.buffers & GL_DEPTH_BUFFER_BIT) != 0;
	bool			stencil			= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	// Textures
	deUint32 metaballsTex	= 5;
	deUint32 quadsTex		= 6;
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	// Fbo A
	Framebuffer fboA(context, m_config, width, height);
	fboA.checkCompleteness();

	// Fbo B
	FboConfig cfg = m_config;
	cfg.buffers				&= ~(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	cfg.depthStencilType	 = GL_NONE;
	cfg.depthStencilFormat	 = GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Bind depth/stencil buffers from fbo A to fbo B
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx ? GL_STENCIL_BUFFER_BIT : GL_DEPTH_BUFFER_BIT;
		deUint32	point	= ndx ? GL_STENCIL_ATTACHMENT : GL_DEPTH_ATTACHMENT;

		if ((m_config.buffers & bit) == 0)
			continue;

		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		context.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, fboA.getDepthStencilBuffer(), 0);	break;
			case GL_RENDERBUFFER:	context.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, fboA.getDepthStencilBuffer());	break;
			default:
				TCU_FAIL("Not implemented");
		}
	}

	// Setup uniforms
	texShader.setUniforms(context, texShaderID);

	// Clear color to red and stencil to 1 in fbo B.
	context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	context.clearStencil(1);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_DEPTH_TEST);

	// Render quad to fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (stencil)
	{
		// Clear subset of stencil buffer to 0 in fbo A
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(0);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);
	}

	// Render metaballs to fbo B
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		// Render quad with stencil mask == 0
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 0, 0xffu);
		context.useProgram(flatShaderID);
		flatShader.setColor(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (m_config.colorType == GL_TEXTURE_2D)
	{
		// Render both to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorBuffer());
		sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));
		context.bindTexture(GL_TEXTURE_2D, fboB.getColorBuffer());
		sglr::drawQuad(context, texShaderID, Vec3(0.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
	{
		// Read results from fbo B
		readPixels(context, dst, 0, 0, width, height, glu::mapGLInternalFormat(m_config.colorFormat), Vec4(1.0f), Vec4(0.0f));
	}
}